

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

void glfwSetInputMode(GLFWwindow *handle,int mode,int value)

{
  _GLFWwindow *window;
  int value_local;
  int mode_local;
  GLFWwindow *handle_local;
  
  if (_glfwInitialized == '\0') {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else if (mode == 0x33001) {
    setCursorMode((_GLFWwindow *)handle,value);
  }
  else if (mode == 0x33002) {
    setStickyKeys((_GLFWwindow *)handle,(uint)(value != 0));
  }
  else if (mode == 0x33003) {
    setStickyMouseButtons((_GLFWwindow *)handle,(uint)(value != 0));
  }
  else {
    _glfwInputError(0x10003,"Invalid input mode");
  }
  return;
}

Assistant:

GLFWAPI void glfwSetInputMode(GLFWwindow* handle, int mode, int value)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;

    _GLFW_REQUIRE_INIT();

    switch (mode)
    {
        case GLFW_CURSOR:
            setCursorMode(window, value);
            break;
        case GLFW_STICKY_KEYS:
            setStickyKeys(window, value ? GL_TRUE : GL_FALSE);
            break;
        case GLFW_STICKY_MOUSE_BUTTONS:
            setStickyMouseButtons(window, value ? GL_TRUE : GL_FALSE);
            break;
        default:
            _glfwInputError(GLFW_INVALID_ENUM, "Invalid input mode");
            break;
    }
}